

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

void FAudio_OPERATIONSET_QueueStart(FAudioSourceVoice *voice,uint32_t Flags,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  uint32_t in_ESI;
  undefined8 in_RDI;
  FAudio_OPERATIONSET_Operation *op;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x1354d2);
  pFVar1 = QueueOperation((FAudioVoice *)op,(FAudio_OPERATIONSET_Type)((ulong)in_RDI >> 0x20),
                          (uint32_t)in_RDI);
  (pFVar1->Data).EnableEffect.EffectIndex = in_ESI;
  FAudio_PlatformUnlockMutex((FAudioMutex)0x135505);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueStart(
	FAudioSourceVoice *voice,
	uint32_t Flags,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_START,
		OperationSet
	);

	op->Data.Start.Flags = Flags;

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}